

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O2

void __thiscall flow::Value::Value(Value *this,LiteralType ty,string *name)

{
  unsigned_long_long *in_R8;
  string_view format_str;
  string sStack_38;
  
  this->_vptr_Value = (_func_int **)&PTR__Value_00195670;
  this->type_ = ty;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->name_)._M_string_length == 0) {
    format_str.size_ = (size_t)&valueCounter;
    format_str.data_ = (char *)0x9;
    fmt::v5::format<unsigned_long_long>(&sStack_38,(v5 *)"unnamed{}",format_str,in_R8);
    std::__cxx11::string::operator=((string *)&this->name_,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    valueCounter = valueCounter + 1;
  }
  return;
}

Assistant:

Value::Value(LiteralType ty, const std::string& name)
    : type_(ty), name_(name), uses_() {
  if (name_.empty()) {
    name_ = fmt::format("unnamed{}", valueCounter);
    valueCounter++;
    // printf("default-create name: %s\n", name_.c_str());
  }
}